

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testArgumentParser.cxx
# Opt level: O3

Continue __thiscall
anon_unknown.dwarf_12aeb::Result::Func4(Result *this,string_view key,string_view arg)

{
  Continue CVar1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  int *piVar2;
  key_type local_58;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  local_38._M_str = arg._M_str;
  local_38._M_len = arg._M_len;
  piVar2 = (int *)key._M_str;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,piVar2,(long)piVar2 + key._M_len);
  this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::operator[](&this->Func4_,&local_58);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>(this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  CVar1 = No;
  if (key._M_len == 7) {
    CVar1 = (Continue)(*(int *)((long)piVar2 + 3) == 0x62345f43 && *piVar2 == 0x434e5546);
  }
  return CVar1;
}

Assistant:

ArgumentParser::Continue Func4(cm::string_view key, cm::string_view arg)
  {
    Func4_[std::string(key)].emplace_back(arg);
    return key == "FUNC_4b" ? ArgumentParser::Continue::Yes
                            : ArgumentParser::Continue::No;
  }